

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall
Assimp::LWOImporter::CountVertsAndFacesLWO2
          (LWOImporter *this,uint *verts,uint *faces,uint16_t **cursor,uint16_t *end,uint max)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar4;
  bool bVar5;
  uint uVar3;
  
  puVar1 = *cursor;
  while ((puVar1 < end && (bVar5 = max != 0, max = max - 1, bVar5))) {
    *cursor = puVar1 + 1;
    uVar2 = *puVar1;
    uVar4 = (uVar2 & 0xff03) << 8 | uVar2 >> 8;
    *verts = *verts + (uint)uVar4;
    *faces = *faces + 1;
    puVar1 = *cursor;
    if ((uVar2 & 0xff03) != 0) {
      uVar3 = 1;
      if (1 < uVar4) {
        uVar3 = (uint)uVar4;
      }
      do {
        puVar1 = puVar1 + (ulong)((char)*puVar1 == -1) + 1;
        *cursor = puVar1;
        uVar2 = (short)uVar3 - 1;
        uVar3 = (uint)uVar2;
      } while (uVar2 != 0);
    }
  }
  return;
}

Assistant:

void LWOImporter::CountVertsAndFacesLWO2(unsigned int& verts, unsigned int& faces,
    uint16_t*& cursor, const uint16_t* const end, unsigned int max)
{
    while (cursor < end && max--)
    {
        uint16_t numIndices;
        ::memcpy(&numIndices, cursor++, 2);
        AI_LSWAP2(numIndices);
        numIndices &= 0x03FF;

        verts += numIndices;
        ++faces;

        for(uint16_t i = 0; i < numIndices; i++)
        {
            ReadVSizedIntLWO2((uint8_t*&)cursor);
        }
    }
}